

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

void __thiscall SetElem::gen(SetElem *this,int b,int a)

{
  element_type *peVar1;
  undefined4 in_register_00000014;
  string s2;
  string s1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  peVar1 = (this->index).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[3])(&local_d0,peVar1,CONCAT44(in_register_00000014,a));
  (**(code **)(*(long *)local_d0._M_dataplus._M_p + 0x30))(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
  (*(((this->expr).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Node).
    _vptr_Node[3])(&local_f0);
  (**(code **)(*(long *)local_f0._M_dataplus._M_p + 0x30))(&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
  (*(((this->arr).super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Expr).super_Node
    ._vptr_Node[6])(&local_b0);
  std::operator+(&local_90,&local_b0," [ ");
  std::operator+(&local_70,&local_90,&local_30);
  std::operator+(&local_f0,&local_70," ] = ");
  std::operator+(&local_50,&local_f0,&local_d0);
  Node::emit((Node *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void gen(int b, int a) override {
		std::string s1 = index->reduce()->toString();
		std::string s2 = expr->reduce()->toString();

		emit(arr->toString() + " [ " + s1 + " ] = " + s2);
	}